

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OneHotEncoder.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::OneHotEncoder::set_allocated_stringcategories
          (OneHotEncoder *this,StringVector *stringcategories)

{
  ulong uVar1;
  Arena *submessage_arena;
  Arena *message_arena;
  
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  message_arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    message_arena = *(Arena **)message_arena;
  }
  clear_CategoryType(this);
  if (stringcategories != (StringVector *)0x0) {
    submessage_arena =
         google::protobuf::internal::InternalMetadata::owning_arena
                   (&(stringcategories->super_MessageLite)._internal_metadata_);
    if (message_arena != submessage_arena) {
      stringcategories =
           (StringVector *)
           google::protobuf::internal::GetOwnedMessageInternal
                     (message_arena,&stringcategories->super_MessageLite,submessage_arena);
    }
    this->_oneof_case_[0] = 1;
    (this->CategoryType_).stringcategories_ = stringcategories;
  }
  return;
}

Assistant:

void OneHotEncoder::set_allocated_stringcategories(::CoreML::Specification::StringVector* stringcategories) {
  ::PROTOBUF_NAMESPACE_ID::Arena* message_arena = GetArenaForAllocation();
  clear_CategoryType();
  if (stringcategories) {
    ::PROTOBUF_NAMESPACE_ID::Arena* submessage_arena =
        ::PROTOBUF_NAMESPACE_ID::Arena::InternalHelper<
            ::PROTOBUF_NAMESPACE_ID::MessageLite>::GetOwningArena(
                reinterpret_cast<::PROTOBUF_NAMESPACE_ID::MessageLite*>(stringcategories));
    if (message_arena != submessage_arena) {
      stringcategories = ::PROTOBUF_NAMESPACE_ID::internal::GetOwnedMessage(
          message_arena, stringcategories, submessage_arena);
    }
    set_has_stringcategories();
    CategoryType_.stringcategories_ = stringcategories;
  }
  // @@protoc_insertion_point(field_set_allocated:CoreML.Specification.OneHotEncoder.stringCategories)
}